

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefitool.cpp
# Opt level: O3

void __thiscall UEFITool::showBuilderMessages(UEFITool *this)

{
  undefined8 uVar1;
  uint uVar2;
  QListWidgetItem *this_00;
  pointer ppVar3;
  vector<std::pair<QString,_QModelIndex>,_std::allocator<std::pair<QString,_QModelIndex>_>_>
  messages;
  QByteArray local_80;
  vector<std::pair<QString,_QModelIndex>,_std::allocator<std::pair<QString,_QModelIndex>_>_>
  local_68;
  QVariant local_50;
  
  QListWidget::clear();
  if (this->ffsBuilder != (FfsBuilder *)0x0) {
    std::vector<std::pair<QString,_QModelIndex>,_std::allocator<std::pair<QString,_QModelIndex>_>_>
    ::vector(&local_68,
             (vector<std::pair<QString,_QModelIndex>,_std::allocator<std::pair<QString,_QModelIndex>_>_>
              *)(this->ffsBuilder + 8));
    if (local_68.
        super__Vector_base<std::pair<QString,_QModelIndex>,_std::allocator<std::pair<QString,_QModelIndex>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_68.
        super__Vector_base<std::pair<QString,_QModelIndex>,_std::allocator<std::pair<QString,_QModelIndex>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      ppVar3 = local_68.
               super__Vector_base<std::pair<QString,_QModelIndex>,_std::allocator<std::pair<QString,_QModelIndex>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        this_00 = (QListWidgetItem *)operator_new(0x28);
        QListWidgetItem::QListWidgetItem(this_00,(QString *)ppVar3,(QListWidget *)0x0,0);
        QByteArray::QByteArray(&local_80,(char *)&ppVar3->second,0x18);
        QVariant::QVariant(&local_50,&local_80);
        (**(code **)(*(long *)this_00 + 0x20))(this_00,0x100,&local_50);
        QVariant::~QVariant(&local_50);
        if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,1,8);
          }
        }
        uVar1 = *(undefined8 *)(this->ui + 0x1d0);
        uVar2 = QListWidget::count();
        QListWidget::insertItem((int)uVar1,(QListWidgetItem *)(ulong)uVar2);
        ppVar3 = ppVar3 + 1;
      } while (ppVar3 != local_68.
                         super__Vector_base<std::pair<QString,_QModelIndex>,_std::allocator<std::pair<QString,_QModelIndex>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    QTabWidget::setTabEnabled((int)*(undefined8 *)(this->ui + 0x150),true);
    QTabWidget::setCurrentIndex((int)*(undefined8 *)(this->ui + 0x150));
    QAbstractItemView::scrollToBottom();
    std::vector<std::pair<QString,_QModelIndex>,_std::allocator<std::pair<QString,_QModelIndex>_>_>
    ::~vector(&local_68);
  }
  return;
}

Assistant:

void UEFITool::showBuilderMessages()
{
    ui->builderMessagesListWidget->clear();
    if (!ffsBuilder)
        return;
    
    std::vector<std::pair<QString, QModelIndex> > messages = ffsBuilder->getMessages();
    
    for (const auto &msg : messages) {
        QListWidgetItem* item = new QListWidgetItem(msg.first, NULL, 0);
        item->setData(Qt::UserRole, QByteArray((const char*)&msg.second, sizeof(msg.second)));
        ui->builderMessagesListWidget->addItem(item);
    }
    
    ui->messagesTabWidget->setTabEnabled(TAB_BUILDER, true);
    ui->messagesTabWidget->setCurrentIndex(TAB_BUILDER);
    ui->builderMessagesListWidget->scrollToBottom();
}